

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float64 helper_rsqrte_f64_aarch64(float64 input,void *fpstp)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t value;
  float64 local_50;
  float64 nan;
  uint64_t f64_frac;
  int f64_exp;
  _Bool f64_sign;
  uint64_t val;
  float64 f64;
  float_status *s;
  void *fpstp_local;
  float64 input_local;
  
  f64 = (float64)fpstp;
  s = (float_status *)fpstp;
  fpstp_local = (void *)input;
  _f64_exp = float64_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  val = _f64_exp;
  iVar1 = float64_is_neg(_f64_exp);
  f64_frac._7_1_ = iVar1 != 0;
  uVar2 = extract64(_f64_exp,0x34,0xb);
  f64_frac._0_4_ = (int)uVar2;
  uVar2 = extract64(_f64_exp,0,0x34);
  iVar1 = float64_is_any_nan(val);
  if (iVar1 == 0) {
    iVar1 = float64_is_zero(val);
    if (iVar1 == 0) {
      iVar1 = float64_is_neg(val);
      if (iVar1 == 0) {
        iVar1 = float64_is_infinity(val);
        if (iVar1 == 0) {
          uVar2 = recip_sqrt_estimate((int *)&f64_frac,0xbfc,uVar2);
          _f64_exp = deposit64(0,0x3d,1,(ulong)(f64_frac._7_1_ & 1));
          value = deposit64(_f64_exp,0x34,0xb,(long)(int)f64_frac);
          _f64_exp = value;
          uVar2 = extract64(uVar2,0x2c,8);
          input_local = deposit64(value,0x2c,8,uVar2);
        }
        else {
          input_local = 0;
        }
      }
      else {
        float_raise_aarch64('\x01',(float_status *)f64);
        input_local = float64_default_nan_aarch64((float_status *)f64);
      }
    }
    else {
      float_raise_aarch64('\x04',(float_status *)f64);
      iVar1 = float64_is_neg(val);
      input_local = float64_set_sign(0x7ff0000000000000,iVar1);
    }
  }
  else {
    local_50 = val;
    iVar1 = float64_is_signaling_nan_aarch64(val,(float_status *)f64);
    if (iVar1 != 0) {
      float_raise_aarch64('\x01',(float_status *)f64);
      local_50 = float64_silence_nan_aarch64(val,(float_status *)f64);
    }
    if (*(char *)(f64 + 6) != '\0') {
      local_50 = float64_default_nan_aarch64((float_status *)f64);
    }
    input_local = local_50;
  }
  return input_local;
}

Assistant:

float64 HELPER(rsqrte_f64)(float64 input, void *fpstp)
{
    float_status *s = fpstp;
    float64 f64 = float64_squash_input_denormal(input, s);
    uint64_t val = float64_val(f64);
    bool f64_sign = float64_is_neg(f64);
    int f64_exp = extract64(val, 52, 11);
    uint64_t f64_frac = extract64(val, 0, 52);

    if (float64_is_any_nan(f64)) {
        float64 nan = f64;
        if (float64_is_signaling_nan(f64, s)) {
            float_raise(float_flag_invalid, s);
            nan = float64_silence_nan(f64, s);
        }
        if (s->default_nan_mode) {
            nan =  float64_default_nan(s);
        }
        return nan;
    } else if (float64_is_zero(f64)) {
        float_raise(float_flag_divbyzero, s);
        return float64_set_sign(float64_infinity, float64_is_neg(f64));
    } else if (float64_is_neg(f64)) {
        float_raise(float_flag_invalid, s);
        return float64_default_nan(s);
    } else if (float64_is_infinity(f64)) {
        return float64_zero;
    }

    f64_frac = recip_sqrt_estimate(&f64_exp, 3068, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(44) */
    val = deposit64(0, 61, 1, f64_sign);
    val = deposit64(val, 52, 11, f64_exp);
    val = deposit64(val, 44, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float64(val);
}